

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckImage(TidyDocImpl *doc,Node *node)

{
  tmbchar *s1;
  long lVar1;
  TidyAttrId TVar2;
  uint uVar3;
  Node *pNVar4;
  Lexer *pLVar5;
  Node *pNVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  Bool BVar12;
  int iVar13;
  uint uVar14;
  ctmbstr ptVar15;
  ulong uVar16;
  bool bVar17;
  ctmbstr cp;
  char *pcVar18;
  AttVal *pAVar19;
  Node *node_00;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  pAVar19 = node->attributes;
  if (pAVar19 == (AttVal *)0x0) {
    bVar7 = true;
    bVar11 = false;
    bVar9 = 0;
    bVar17 = false;
    bVar8 = false;
  }
  else {
    bVar7 = false;
    bVar8 = false;
    bVar17 = false;
    bVar10 = false;
    bVar9 = 0;
    bVar11 = false;
    do {
      if (pAVar19->dict != (Attribute *)0x0) {
        TVar2 = pAVar19->dict->id;
        if ((int)TVar2 < 0x4f) {
          if (TVar2 == TidyAttr_ALT) {
            if (pAVar19->value != (ctmbstr)0x0) {
              uVar14 = prvTidytmbstrlen(pAVar19->value);
              ptVar15 = pAVar19->value;
              if (((uVar14 < 0x96) && (BVar12 = IsPlaceholderAlt(ptVar15), BVar12 == no)) &&
                 (pcVar18 = strstr(ptVar15,"object"), pcVar18 == (char *)0x0)) {
                BVar12 = EndsWithBytes(ptVar15);
                ptVar15 = pAVar19->value;
                if (BVar12 != no) goto LAB_00153c93;
                BVar12 = IsImage(ptVar15);
                if (BVar12 != no) {
                  ptVar15 = pAVar19->value;
                  goto LAB_00153c93;
                }
              }
              else {
LAB_00153c93:
                uVar14 = prvTidytmbstrlen(ptVar15);
                if (uVar14 < 0x97) {
                  BVar12 = IsImage(pAVar19->value);
                  if (BVar12 == no) {
                    ptVar15 = pAVar19->value;
                    BVar12 = IsPlaceholderAlt(ptVar15);
                    if (BVar12 == no) {
                      BVar12 = EndsWithBytes(ptVar15);
                      if (BVar12 == no) goto LAB_00153d13;
                      uVar14 = 0x296;
                    }
                    else {
                      uVar14 = 0x297;
                    }
                  }
                  else {
                    uVar14 = 0x295;
                  }
                }
                else {
                  uVar14 = 0x298;
                }
                prvTidyReportAccessError(doc,node,uVar14);
              }
              bVar7 = true;
            }
          }
          else if (TVar2 == TidyAttr_HEIGHT) {
            pcVar18 = pAVar19->value;
            if (pcVar18 != (char *)0x0) {
              do {
                if (*pcVar18 == '\0') goto LAB_00153d13;
                BVar12 = prvTidyIsWhite((int)*pcVar18);
                pcVar18 = pcVar18 + 1;
              } while (BVar12 != no);
              iVar13 = atoi(pAVar19->value);
              if (iVar13 < 0x1e) {
                bVar9 = 1;
              }
            }
          }
          else {
LAB_00153caf:
            if (TVar2 == TidyAttr_ISMAP) {
              bVar8 = true;
            }
          }
        }
        else if (TVar2 == TidyAttr_LONGDESC) {
          pcVar18 = pAVar19->value;
          if (pcVar18 != (char *)0x0) {
            do {
              if (*pcVar18 == '\0') goto LAB_00153d13;
              BVar12 = prvTidyIsWhite((int)*pcVar18);
              pcVar18 = pcVar18 + 1;
            } while (BVar12 != no);
            uVar14 = prvTidytmbstrlen(pAVar19->value);
            if (1 < uVar14) {
              bVar11 = true;
            }
          }
        }
        else if (TVar2 == TidyAttr_USEMAP) {
          pcVar18 = pAVar19->value;
          if (pcVar18 != (char *)0x0) {
            do {
              if (*pcVar18 == '\0') goto LAB_00153d13;
              BVar12 = prvTidyIsWhite((int)*pcVar18);
              pcVar18 = pcVar18 + 1;
            } while (BVar12 != no);
            (doc->access).HasUseMap = yes;
          }
        }
        else {
          if (TVar2 != TidyAttr_WIDTH) goto LAB_00153caf;
          pcVar18 = pAVar19->value;
          if (pcVar18 != (char *)0x0) {
            do {
              if (*pcVar18 == '\0') goto LAB_00153d13;
              BVar12 = prvTidyIsWhite((int)*pcVar18);
              pcVar18 = pcVar18 + 1;
            } while (BVar12 != no);
            iVar13 = atoi(pAVar19->value);
            if (iVar13 < 0x1e) {
              bVar10 = true;
            }
            if (0x96 < iVar13) {
              bVar17 = true;
            }
          }
        }
      }
LAB_00153d13:
      pAVar19 = pAVar19->next;
    } while (pAVar19 != (AttVal *)0x0);
    bVar7 = !bVar7;
    bVar17 = bVar17 || bVar10;
  }
  node_00 = node->next;
  if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
     ((node_00->tag->id != TidyTag_A ||
      (pNVar4 = node_00->content, node = node_00, pNVar4 == (Node *)0x0)))) {
    bVar10 = false;
    node_00 = node;
  }
  else {
    bVar10 = false;
    if (pNVar4->tag == (Dict *)0x0) {
      s1 = (doc->access).text;
      uVar3 = pNVar4->start;
      if (uVar3 < pNVar4->end) {
        pLVar5 = doc->lexer;
        uVar16 = 0;
        do {
          s1[uVar16] = pLVar5->lexbuf[uVar16 + uVar3];
          if (uVar16 == 0x7f) {
            uVar16 = 0x7f;
            break;
          }
          lVar1 = uVar3 + uVar16;
          uVar16 = uVar16 + 1;
        } while (lVar1 + 1U < (ulong)pNVar4->end);
        uVar16 = uVar16 & 0xffffffff;
      }
      else {
        uVar16 = 0;
      }
      s1[uVar16] = '\0';
      iVar13 = prvTidytmbstrcmp(s1,"d");
      if (iVar13 != 0) {
        iVar13 = prvTidytmbstrcmp(s1,"D");
        bVar10 = false;
        if (iVar13 != 0) goto LAB_00153de1;
      }
      bVar10 = true;
    }
  }
LAB_00153de1:
  pNVar4 = node_00->next;
  if (((pNVar4 != (Node *)0x0) && (pNVar4->tag == (Dict *)0x0)) &&
     ((pNVar6 = pNVar4->next, node_00 = pNVar4, pNVar6 != (Node *)0x0 &&
      ((((pNVar6->tag != (Dict *)0x0 && (pNVar6->tag->id == TidyTag_A)) &&
        (pNVar4 = pNVar6->content, node_00 = pNVar6, pNVar4 != (Node *)0x0)) &&
       (pNVar4->tag == (Dict *)0x0)))))) {
    ptVar15 = textFromOneNode(doc,pNVar4);
    iVar13 = prvTidytmbstrcmp(ptVar15,"d");
    if ((iVar13 == 0) || (iVar13 = prvTidytmbstrcmp(ptVar15,"D"), iVar13 == 0)) {
      bVar10 = true;
    }
  }
  if (bVar7) {
    prvTidyReportAccessError(doc,node_00,0x294);
  }
  if (!(bool)(!bVar11 & bVar9 & bVar17)) {
    uVar14 = 0x29b;
    if ((bVar10 && !bVar11) || (uVar14 = 0x29a, bVar11 && !bVar10)) {
      prvTidyReportAccessError(doc,node_00,uVar14);
    }
    if (!bVar10 && !bVar11) {
      prvTidyReportAccessError(doc,node_00,0x299);
    }
  }
  if (!bVar8) {
    return;
  }
  prvTidyReportAccessError(doc,node_00,0x2eb);
  prvTidyReportAccessError(doc,node_00,0x2a9);
  return;
}

Assistant:

static void CheckImage( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasIsMap = no;
    Bool HasLongDesc = no;
    Bool HasDLINK = no;
    Bool HasValidHeight = no;
    Bool HasValidWidthBullet = no;
    Bool HasValidWidthHR = no; 
    Bool HasTriggeredMissingLongDesc = no;

    AttVal* av;
                
    if (Level1_Enabled( doc ))
    {
        /* Checks all image attributes for invalid values within attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* 
               Checks for valid ALT attribute.
               The length of the alt text must be less than 150 characters 
               long.
            */
            if ( attrIsALT(av) )
            {
                if (av->value != NULL) 
                {
                    if ((TY_(tmbstrlen)(av->value) < 150) &&
                        (IsPlaceholderAlt (av->value) == no) &&
                        (IsPlaceHolderObject (av->value) == no) &&
                        (EndsWithBytes (av->value) == no) &&
                        (IsImage (av->value) == no))
                    {
                        HasAlt = yes;
                    }

                    else if (TY_(tmbstrlen)(av->value) > 150)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_TOO_LONG );
                    }

                    else if (IsImage (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILENAME);
                    }
            
                    else if (IsPlaceholderAlt (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_PLACEHOLDER);
                    }

                    else if (EndsWithBytes (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILE_SIZE);
                    }
                }
            }

            /* 
               Checks for width values of 'bullets' and 'horizontal
               rules' for validity.

               Valid pixel width for 'bullets' must be < 30, and > 150 for
               horizontal rules.
            */
            else if ( attrIsWIDTH(av) )
            {
                /* Longdesc attribute needed if width attribute is not present. */
                if ( hasValue(av) )
                {
                    int width = atoi( av->value );
                    if ( width < 30 )
                        HasValidWidthBullet = yes;

                    if ( width > 150 )
                        HasValidWidthHR = yes;
                }
            }

            /* 
               Checks for height values of 'bullets' and horizontal
               rules for validity.

               Valid pixel height for 'bullets' and horizontal rules 
               mustt be < 30.
            */
            else if ( attrIsHEIGHT(av) )
            {
                /* Longdesc attribute needed if height attribute not present. */
                if ( hasValue(av) && atoi(av->value) < 30 )
                    HasValidHeight = yes;
            }

            /* 
               Checks for longdesc and determines validity.  
               The length of the 'longdesc' must be > 1
            */
            else if ( attrIsLONGDESC(av) )
            {
                if ( hasValue(av) && TY_(tmbstrlen)(av->value) > 1 )
                    HasLongDesc = yes;
              }

            /* 
               Checks for 'USEMAP' attribute.  Ensures that
               text links are provided for client-side image maps
            */
            else if ( attrIsUSEMAP(av) )
            {
                if ( hasValue(av) )
                    doc->access.HasUseMap = yes;
            }    

            else if ( attrIsISMAP(av) )
            {
                HasIsMap = yes;
            }
        }    
        
        
        /* 
            Check to see if a dLINK is present.  The ANCHOR element must
            be present following the IMG element.  The text found between 
            the ANCHOR tags must be < 6 characters long, and must contain
            the letter 'd'.
        */
        if ( nodeIsA(node->next) )
        {
            node = node->next;
            
            /* 
                Node following the anchor must be a text node
                for dLINK to exist 
            */

            if (node->content != NULL && (node->content)->tag == NULL)
            {
                /* Number of characters found within the text node */
                ctmbstr word = textFromOneNode( doc, node->content);
                    
                if ((TY_(tmbstrcmp)(word,"d") == 0)||
                    (TY_(tmbstrcmp)(word,"D") == 0))
                {
                    HasDLINK = yes;
                }
            }
        }
                    
        /*
            Special case check for dLINK.  This will occur if there is 
            whitespace between the <img> and <a> elements.  Ignores 
            whitespace and continues check for dLINK.
        */
        
        if ( node->next && !node->next->tag )
        {
            node = node->next;

            if ( nodeIsA(node->next) )
            {
                node = node->next;

                /* 
                    Node following the ANCHOR must be a text node
                    for dLINK to exist 
                */
                if (node->content != NULL && node->content->tag == NULL)
                {
                    /* Number of characters found within the text node */
                    ctmbstr word = textFromOneNode( doc, node->content );

                    if ((TY_(tmbstrcmp)(word, "d") == 0)||
                        (TY_(tmbstrcmp)(word, "D") == 0))
                    {
                        HasDLINK = yes;
                    }
                }
            }
        }

        if ((HasAlt == no)&&
            (HasValidWidthBullet == yes)&&
            (HasValidHeight == yes))
        {
        }

        if ((HasAlt == no)&&
            (HasValidWidthHR == yes)&&
            (HasValidHeight == yes))
        {
        }

        if (HasAlt == no)
        {
            TY_(ReportAccessError)( doc, node, IMG_MISSING_ALT);
        }

        if ((HasLongDesc == no)&&
            (HasValidHeight ==yes)&&
            ((HasValidWidthHR == yes)||
             (HasValidWidthBullet == yes)))
        {
            HasTriggeredMissingLongDesc = yes;
        }

        if (HasTriggeredMissingLongDesc == no)
        {
            if ((HasDLINK == yes)&&
                (HasLongDesc == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC);
            }

            if ((HasLongDesc == yes)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_DLINK);
            }

            if ((HasLongDesc == no)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC_DLINK);
            }
        }

        if (HasIsMap == yes)
        {
            TY_(ReportAccessError)( doc, node, IMAGE_MAP_SERVER_SIDE_REQUIRES_CONVERSION);

            TY_(ReportAccessError)( doc, node, IMG_MAP_SERVER_REQUIRES_TEXT_LINKS);
        }
    }
}